

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat.h
# Opt level: O0

LatticeComparison __thiscall
wasm::analysis::Flat<bool>::compare(Flat<bool> *this,Element *a,Element *b)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  bool *pbVar4;
  int __c;
  int __c_00;
  int __c_01;
  Element *__s;
  bool *pA;
  Element *b_local;
  Element *a_local;
  Flat<bool> *this_local;
  
  __s = a;
  pcVar2 = std::variant<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>::
           index(&a->
                  super_variant<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                 ,(char *)a,(int)b);
  pcVar3 = std::variant<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>::
           index(&b->
                  super_variant<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                 ,(char *)__s,__c);
  if (pcVar2 < pcVar3) {
    this_local._4_4_ = LESS;
  }
  else {
    pcVar2 = std::variant<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>::
             index(&a->
                    super_variant<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                   ,(char *)__s,__c_00);
    pcVar3 = std::variant<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>::
             index(&b->
                    super_variant<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                   ,(char *)__s,__c_01);
    if (pcVar3 < pcVar2) {
      this_local._4_4_ = GREATER;
    }
    else {
      pbVar4 = Element::getVal(a);
      if ((pbVar4 != (bool *)0x0) &&
         (bVar1 = *pbVar4, pbVar4 = Element::getVal(b), (bVar1 & 1U) != (*pbVar4 & 1U))) {
        return NO_RELATION;
      }
      this_local._4_4_ = EQUAL;
    }
  }
  return this_local._4_4_;
}

Assistant:

LatticeComparison compare(const Element& a, const Element& b) const noexcept {
    if (a.index() < b.index()) {
      return LESS;
    } else if (a.index() > b.index()) {
      return GREATER;
    } else if (auto pA = a.getVal(); pA && *pA != *b.getVal()) {
      return NO_RELATION;
    } else {
      return EQUAL;
    }
  }